

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rendsig.c
# Opt level: O2

int32 duh_render_signal(DUH_SIGRENDERER *sigrenderer,float volume,float delta,int32 size,
                       sample_t_conflict **samples)

{
  uint uVar1;
  int32 iVar2;
  sample_t_conflict **samples_00;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (samples != (sample_t_conflict **)0x0) {
    samples_00 = allocate_sample_buffer(sigrenderer->n_channels,size);
    if (samples_00 == (sample_t_conflict **)0x0) {
      uVar1 = 0;
    }
    else {
      dumb_silence(*samples_00,sigrenderer->n_channels * size);
      uVar1 = duh_sigrenderer_generate_samples
                        (sigrenderer,(double)volume,(double)delta,size,samples_00);
      lVar3 = 0;
      uVar4 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar4 = 0;
      }
      for (; lVar3 < sigrenderer->n_channels; lVar3 = lVar3 + 1) {
        for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
          samples[lVar3][uVar5] =
               samples[lVar3][uVar5] +
               ((*samples_00)[sigrenderer->n_channels * (int)uVar5 + (int)lVar3] >> 8);
        }
      }
      destroy_sample_buffer(samples_00);
    }
    return uVar1;
  }
  iVar2 = duh_sigrenderer_generate_samples
                    (sigrenderer,(double)volume,(double)delta,size,(sample_t_conflict **)0x0);
  return iVar2;
}

Assistant:

int32 duh_render_signal(
	DUH_SIGRENDERER *sigrenderer,
	float volume, float delta,
	int32 size, sample_t **samples
)
{
	sample_t **s;
	int32 rendered;
	int32 i;
	int j;
	if (!samples) return duh_sigrenderer_generate_samples(sigrenderer, volume, delta, size, NULL);
	s = allocate_sample_buffer(sigrenderer->n_channels, size);
	if (!s) return 0;
	dumb_silence(s[0], sigrenderer->n_channels * size);
	rendered = duh_sigrenderer_generate_samples(sigrenderer, volume, delta, size, s);
	for (j = 0; j < sigrenderer->n_channels; j++)
		for (i = 0; i < rendered; i++)
			samples[j][i] += s[0][i*sigrenderer->n_channels+j] >> 8;
	destroy_sample_buffer(s);
	return rendered;
}